

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O0

RBTNode * rbt_leftmost(RBTree *rbt)

{
  RBTNode *local_28;
  RBTNode *leftmost;
  RBTNode *node;
  RBTree *rbt_local;
  
  local_28 = rbt->root;
  for (leftmost = rbt->root; leftmost != &g_sentinel; leftmost = leftmost->left) {
    local_28 = leftmost;
  }
  if (local_28 == &g_sentinel) {
    rbt_local = (RBTree *)0x0;
  }
  else {
    rbt_local = (RBTree *)local_28;
  }
  return (RBTNode *)rbt_local;
}

Assistant:

RBTNode *
rbt_leftmost(RBTree *rbt)
{
    RBTNode    *node = rbt->root;
    RBTNode    *leftmost = rbt->root;

    while (node != RBTNIL)
    {
        leftmost = node;
        node = node->left;
    }

    if (leftmost != RBTNIL)
        return leftmost;

    return NULL;
}